

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::QPDFArrayItems::iterator::iterator
          (iterator *this,QPDFObjectHandle *oh,bool for_begin)

{
  int iVar1;
  Members *__p;
  undefined3 in_register_00000011;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002f0038;
  __p = (Members *)operator_new(0x10);
  __p->oh = oh;
  iVar1 = 0;
  if (CONCAT31(in_register_00000011,for_begin) == 0) {
    iVar1 = getArrayNItems(oh);
  }
  __p->item_number = iVar1;
  (this->m).
  super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFObjectHandle::QPDFArrayItems::iterator::Members*>
            (&(this->m).
              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (this->ivalue).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->ivalue).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  updateIValue(this);
  return;
}

Assistant:

QPDFObjectHandle::QPDFArrayItems::iterator::iterator(QPDFObjectHandle& oh, bool for_begin) :
    m(new Members(oh, for_begin))
{
    updateIValue();
}